

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O1

int Mpm_ManDeriveCuts(Mpm_Man_t *p,Mig_Obj_t *pObj)

{
  int *piVar1;
  Mig_Fan_t MVar2;
  Mmr_Step_t *pMVar3;
  Mpm_Cut_t *pMVar4;
  Mpm_Cut_t *pCut2;
  Mpm_Uni_t *pMVar5;
  uint uVar6;
  Mpm_Cut_t *pMVar7;
  Mig_Obj_t *pMVar8;
  ulong uVar9;
  byte bVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  undefined4 *puVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  Mpm_Cut_t *pCut;
  Mpm_Cut_t *local_38;
  
  uVar6 = (uint)pObj->pFans[3] >> 1;
  if (((int)uVar6 < (p->vRequireds).nSize) && ((int)uVar6 < (p->vCutBests).nSize)) {
    if ((p->vFreeUnits).nSize != p->nNumCuts + 1) {
      __assert_fail("Vec_PtrSize( &p->vFreeUnits ) == p->nNumCuts + 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                    ,0x24e,"int Mpm_ManDeriveCuts(Mpm_Man_t *, Mig_Obj_t *)");
    }
    if ((p->vCutLists).nSize <= (int)uVar6) goto LAB_0047d0e6;
    if ((p->vCutLists).pArray[uVar6] != 0) {
      __assert_fail("Mpm_ObjCutList(p, pObj) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                    ,0x24f,"int Mpm_ManDeriveCuts(Mpm_Man_t *, Mig_Obj_t *)");
    }
    uVar12 = (p->vRequireds).pArray[uVar6];
    uVar6 = (p->vCutBests).pArray[uVar6];
    p->nCutStore = 0;
    if (0 < (int)uVar6) {
      pMVar7 = Mpm_ObjCutBestP(p,pObj);
      uVar9 = 0;
      if (0x7ffffff < *(uint *)&pMVar7->field_0x4) {
        uVar23 = (ulong)(*(uint *)&pMVar7->field_0x4 >> 0x1b);
        uVar15 = 0;
        uVar9 = 0;
        do {
          if (pMVar7->pLeaves[uVar15] < 0) {
LAB_0047d00d:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          uVar18 = p->pLibLut->pLutDelays[uVar23][uVar15] +
                   (p->vTimes).pArray[(uint)pMVar7->pLeaves[uVar15] >> 1];
          if ((int)uVar9 <= (int)uVar18) {
            uVar9 = (ulong)uVar18;
          }
          uVar15 = uVar15 + 1;
        } while (uVar23 != uVar15);
      }
      if (pMVar7->hNext != 0) {
        __assert_fail("pCut->hNext == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                      ,0x255,"int Mpm_ManDeriveCuts(Mpm_Man_t *, Mig_Obj_t *)");
      }
      iVar20 = (int)uVar9;
      if ((int)uVar12 < iVar20) {
        printf("Arrival time (%d) exceeds required time (%d) at object %d.\n",uVar9,(ulong)uVar12);
      }
      if (p->fMainRun == 0) {
        uVar18 = (uint)pObj->pFans[3] >> 1;
        if ((p->vTimes).nSize <= (int)uVar18) goto LAB_0047d124;
        (p->vTimes).pArray[uVar18] = iVar20;
      }
      else {
        pMVar7 = Mpm_ManMergeCuts(p,pMVar7,(Mpm_Cut_t *)0x0,(Mpm_Cut_t *)0x0);
        Mpm_ObjAddCutToStore(p,pMVar7,iVar20);
      }
    }
    if (p->pMig->nChoices != 0) {
      uVar18 = (uint)pObj->pFans[3] >> 1;
      lVar13 = *(long *)((long)pObj + (-0x10 - (ulong)((uVar18 & 0xfff) << 4)));
      iVar20 = *(int *)(lVar13 + 0x7c);
      if (iVar20 != 0) {
        if (iVar20 <= (int)uVar18) goto LAB_0047d0e6;
        if (*(int *)(*(long *)(lVar13 + 0x80) + (ulong)uVar18 * 4) != 0) {
          pMVar8 = Mig_ObjSibl(pObj);
          Mpm_ObjAddChoiceCutsToStore(p,pObj,pMVar8,uVar12);
        }
      }
    }
    lVar13 = 0;
    do {
      MVar2 = pObj->pFans[lVar13];
      if (0x7ffffffe < (uint)MVar2 >> 1) break;
      uVar17 = (uint)pObj->pFans[3] >> 1;
      uVar18 = (uint)MVar2 >> 1;
      if (uVar17 <= uVar18) goto LAB_0047d0a8;
      lVar16 = *(long *)((long)pObj + (-0x10 - (ulong)((uVar17 & 0xfff) << 4)));
      if (*(int *)(lVar16 + 8) <= (int)uVar18) goto LAB_0047d0c7;
      if (*(int *)(lVar16 + 0x1c) <= (int)((uint)MVar2 >> 0xd)) goto LAB_0047d04b;
      lVar16 = *(long *)(*(long *)(lVar16 + 0x20) + (ulong)((uint)MVar2 >> 0xd) * 8);
      if (lVar16 == 0) break;
      uVar18 = *(uint *)(lVar16 + 0xc + (ulong)((uVar18 & 0xfff) << 4)) >> 1;
      if ((p->vCutLists).nSize <= (int)uVar18) goto LAB_0047d0e6;
      uVar18 = (p->vCutLists).pArray[uVar18];
      if (uVar18 == 0) {
        iVar20 = 0;
      }
      else {
        pMVar3 = p->pManCuts;
        uVar17 = pMVar3->uMask;
        lVar16 = 0;
        do {
          uVar19 = uVar18 & uVar17;
          if ((int)uVar19 < 1) {
            __assert_fail("(h & p->uMask) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/mem/mem2.h"
                          ,0xee,"word *Mmr_StepEntry(Mmr_Step_t *, int)");
          }
          uVar18 = (int)uVar18 >> ((byte)pMVar3->nBits & 0x1f);
          if ((int)uVar18 < 1) goto LAB_0047d02c;
          puVar14 = (undefined4 *)((long)pMVar3 + (ulong)uVar19 * 0x38 + 0x18);
          if ((int)(puVar14[7] << ((byte)*puVar14 & 0x1f)) <= (int)uVar18) goto LAB_0047d02c;
          bVar10 = (byte)*puVar14 & 0x1f;
          uVar22 = uVar18 >> bVar10;
          if (((int)(uVar18 >> bVar10) < 0) || ((int)puVar14[7] <= (int)uVar22)) goto LAB_0047d04b;
          lVar21 = *(long *)(*(long *)(puVar14 + 8) + (ulong)uVar22 * 8);
          if ((*(uint *)(lVar21 + 4 + (ulong)(uVar18 & puVar14[1]) * 8) >> 0x19) + 0xc >> 3 !=
              uVar19) {
            __assert_fail("Mpm_CutWordNum(pCut->nLeaves) == (h & p->pManCuts->uMask)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmInt.h"
                          ,0xaf,"Mpm_Cut_t *Mpm_CutFetch(Mpm_Man_t *, int)");
          }
          if (lVar21 == 0) break;
          pMVar7 = (Mpm_Cut_t *)(lVar21 + (ulong)(uVar18 & puVar14[1]) * 8);
          p->pCuts[lVar13][lVar16] = pMVar7;
          if (*(uint *)&pMVar7->field_0x4 < 0x8000000) {
            uVar9 = 0;
          }
          else {
            uVar23 = 0;
            uVar9 = 0;
            do {
              if (pMVar7->pLeaves[uVar23] < 0) goto LAB_0047d00d;
              uVar9 = uVar9 | 1L << ((ulong)((uint)pMVar7->pLeaves[uVar23] >> 1 & 0x7f) & 0x3f);
              uVar23 = uVar23 + 1;
            } while (*(uint *)&pMVar7->field_0x4 >> 0x1b != uVar23);
          }
          p->pSigns[lVar13][lVar16] = uVar9;
          lVar16 = lVar16 + 1;
          uVar18 = pMVar7->hNext;
        } while (uVar18 != 0);
        iVar20 = (int)lVar16;
      }
      p->nCuts[lVar13] = iVar20;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    if (0xfffffffd < (uint)pObj->pFans[1]) {
LAB_0047d143:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                    ,0x278,"int Mpm_ManDeriveCuts(Mpm_Man_t *, Mig_Obj_t *)");
    }
    if ((uint)pObj->pFans[2] < 0xfffffffe) {
      if ((0xfffffffd < (uint)pObj->pFans[1]) || (0xfffffffd < (uint)pObj->pFans[2]))
      goto LAB_0047d143;
      if (0 < p->nCuts[0]) {
        lVar13 = 0;
        do {
          pMVar7 = p->pCuts[0][lVar13];
          if (pMVar7 == (Mpm_Cut_t *)0x0) break;
          if (0 < p->nCuts[1]) {
            lVar16 = 0;
            do {
              pMVar4 = p->pCuts[1][lVar16];
              if (pMVar4 == (Mpm_Cut_t *)0x0) break;
              if (0 < p->nCuts[2]) {
                lVar21 = 0;
                do {
                  pCut2 = p->pCuts[2][lVar21];
                  if (pCut2 == (Mpm_Cut_t *)0x0) break;
                  uVar9 = p->pSigns[1][lVar16] | p->pSigns[0][lVar13] | p->pSigns[2][lVar21];
                  uVar9 = uVar9 - (uVar9 >> 1 & 0x5555555555555555);
                  uVar9 = (uVar9 >> 2 & 0x3333333333333333) + (uVar9 & 0x3333333333333333);
                  uVar9 = (uVar9 >> 4) + uVar9 & 0xf0f0f0f0f0f0f0f;
                  uVar9 = (uVar9 >> 8) + uVar9;
                  lVar11 = (uVar9 >> 0x10) + uVar9;
                  if ((int)((int)((ulong)lVar11 >> 0x20) + (int)lVar11 & 0xffU) <= p->nLutSize) {
                    Mpm_ManExploreNewCut(p,pObj,pMVar7,pMVar4,pCut2,uVar12);
                  }
                  lVar21 = lVar21 + 1;
                } while (lVar21 < p->nCuts[2]);
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 < p->nCuts[1]);
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < p->nCuts[0]);
      }
    }
    else if (0 < p->nCuts[0]) {
      lVar13 = 0;
      do {
        pMVar7 = p->pCuts[0][lVar13];
        if (pMVar7 == (Mpm_Cut_t *)0x0) break;
        if (0 < p->nCuts[1]) {
          lVar16 = 0;
          do {
            pMVar4 = p->pCuts[1][lVar16];
            if (pMVar4 == (Mpm_Cut_t *)0x0) break;
            uVar9 = p->pSigns[1][lVar16] | p->pSigns[0][lVar13];
            uVar9 = uVar9 - (uVar9 >> 1 & 0x5555555555555555);
            uVar9 = (uVar9 >> 2 & 0x3333333333333333) + (uVar9 & 0x3333333333333333);
            uVar9 = (uVar9 >> 4) + uVar9 & 0xf0f0f0f0f0f0f0f;
            uVar9 = (uVar9 >> 8) + uVar9;
            lVar21 = (uVar9 >> 0x10) + uVar9;
            if ((int)((int)((ulong)lVar21 >> 0x20) + (int)lVar21 & 0xffU) <= p->nLutSize) {
              Mpm_ManExploreNewCut(p,pObj,pMVar7,pMVar4,(Mpm_Cut_t *)0x0,uVar12);
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 < p->nCuts[1]);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < p->nCuts[0]);
    }
    if (p->nCutStore < 1) {
      __assert_fail("p->nCutStore > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                    ,0x27f,"int Mpm_ManDeriveCuts(Mpm_Man_t *, Mig_Obj_t *)");
    }
    if ((int)uVar12 < p->pCutStore[0]->mTime) {
      if (p->fMainRun != 0) {
        __assert_fail("!p->fMainRun",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                      ,0x28b,"int Mpm_ManDeriveCuts(Mpm_Man_t *, Mig_Obj_t *)");
      }
    }
    else {
      if (uVar6 != 0) {
        pMVar3 = p->pManCuts;
        pMVar3->nEntries = pMVar3->nEntries + -1;
        lVar13 = (long)(int)(pMVar3->uMask & uVar6) * 0x38;
        uVar6 = (int)uVar6 >> ((byte)pMVar3->nBits & 0x1f);
        piVar1 = (int *)((long)pMVar3 + lVar13 + 0x24);
        *piVar1 = *piVar1 + -1;
        if ((int)uVar6 < 1) {
LAB_0047d02c:
          __assert_fail("h > 0 && h < (Vec_PtrSize(&p->vPages) << p->nPageBase)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/mem/mem2.h"
                        ,0xb2,"word *Mmr_FixedEntry(Mmr_Fixed_t *, int)");
        }
        iVar20 = *(int *)((long)pMVar3 + lVar13 + 0x34);
        bVar10 = (byte)*(undefined4 *)((long)pMVar3 + lVar13 + 0x18);
        if (iVar20 << (bVar10 & 0x1f) <= (int)uVar6) goto LAB_0047d02c;
        bVar10 = bVar10 & 0x1f;
        uVar12 = uVar6 >> bVar10;
        if (((int)(uVar6 >> bVar10) < 0) || (iVar20 <= (int)uVar12)) {
LAB_0047d04b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        memset((void *)((ulong)(*(uint *)((long)pMVar3 + lVar13 + 0x1c) & uVar6) * 8 +
                       *(long *)(*(long *)((long)pMVar3 + lVar13 + 0x38) + (ulong)uVar12 * 8)),0xff,
               (long)*(int *)((long)pMVar3 + lVar13 + 0x20) << 3);
        Vec_IntPush((Vec_Int_t *)((long)pMVar3 + lVar13 + 0x40),uVar6);
      }
      pMVar5 = p->pCutStore[0];
      uVar6 = Mpm_CutAlloc(p,*(uint *)&(pMVar5->pCut).field_0x4 >> 0x1b,&local_38);
      uVar18 = *(uint *)&(pMVar5->pCut).field_0x4 & 0x1ffffff;
      uVar12 = *(uint *)&local_38->field_0x4;
      *(uint *)&local_38->field_0x4 = uVar12 & 0xfe000000 | uVar18;
      uVar17 = *(uint *)&(pMVar5->pCut).field_0x4 & 0x2000000;
      *(uint *)&local_38->field_0x4 = uVar12 & 0xfc000000 | uVar18 | uVar17;
      uVar19 = *(uint *)&(pMVar5->pCut).field_0x4 & 0x4000000;
      *(uint *)&local_38->field_0x4 = uVar12 & 0xf8000000 | uVar18 | uVar17 | uVar19;
      *(uint *)&local_38->field_0x4 =
           uVar18 | uVar17 | uVar19 | *(uint *)&(pMVar5->pCut).field_0x4 & 0xf8000000;
      memcpy(local_38->pLeaves,(pMVar5->pCut).pLeaves,
             (ulong)(*(uint *)&(pMVar5->pCut).field_0x4 >> 0x19 & 0xfffffffc));
      uVar12 = (uint)pObj->pFans[3] >> 1;
      if ((p->vCutBests).nSize <= (int)uVar12) {
LAB_0047d124:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (p->vCutBests).pArray[uVar12] = uVar6;
      uVar12 = (uint)pObj->pFans[3] >> 1;
      if ((p->vTimes).nSize <= (int)uVar12) goto LAB_0047d124;
      pMVar5 = p->pCutStore[0];
      (p->vTimes).pArray[uVar12] = pMVar5->mTime;
      uVar12 = (uint)pObj->pFans[3] >> 1;
      if ((p->vAreas).nSize <= (int)uVar12) goto LAB_0047d124;
      (p->vAreas).pArray[uVar12] = pMVar5->mArea;
      uVar12 = (uint)pObj->pFans[3] >> 1;
      if ((p->vEdges).nSize <= (int)uVar12) goto LAB_0047d124;
      (p->vEdges).pArray[uVar12] = pMVar5->mEdge;
    }
    if ((int)uVar6 < 1) {
      __assert_fail("hCutBest > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                    ,0x28c,"int Mpm_ManDeriveCuts(Mpm_Man_t *, Mig_Obj_t *)");
    }
    Mpm_ObjTranslateCutsFromStore(p,pObj);
    lVar13 = 0;
    do {
      MVar2 = pObj->pFans[lVar13];
      if (0x7ffffffe < (uint)MVar2 >> 1) break;
      uVar12 = (uint)pObj->pFans[3] >> 1;
      uVar6 = (uint)MVar2 >> 1;
      if (uVar12 <= uVar6) {
LAB_0047d0a8:
        __assert_fail("i < 3 && Mig_FanId(p, i) < Mig_ObjId(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMig.h"
                      ,0xaa,"int Mig_ObjFaninId(Mig_Obj_t *, int)");
      }
      lVar16 = *(long *)((long)pObj + (-0x10 - (ulong)((uVar12 & 0xfff) << 4)));
      if (*(int *)(lVar16 + 8) <= (int)uVar6) {
LAB_0047d0c7:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMig.h"
                      ,0x74,"Mig_Obj_t *Mig_ManObj(Mig_Man_t *, int)");
      }
      if (*(int *)(lVar16 + 0x1c) <= (int)((uint)MVar2 >> 0xd)) goto LAB_0047d04b;
      lVar16 = *(long *)(*(long *)(lVar16 + 0x20) + (ulong)((uint)MVar2 >> 0xd) * 8);
      if (lVar16 == 0) break;
      pMVar8 = (Mig_Obj_t *)(lVar16 + (ulong)((uVar6 & 0xfff) << 4));
      if ((uint)pMVar8->pFans[1] < 0xfffffffe) {
        uVar6 = (uint)pMVar8->pFans[3] >> 1;
        if ((p->vMigRefs).nSize <= (int)uVar6) goto LAB_0047d105;
        piVar1 = (p->vMigRefs).pArray + uVar6;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Mpm_ObjRecycleCuts(p,pMVar8);
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    pMVar8 = Mig_ObjSibl(pObj);
    if (pMVar8 != (Mig_Obj_t *)0x0) {
      uVar6 = (uint)pMVar8->pFans[3] >> 1;
      if ((p->vMigRefs).nSize <= (int)uVar6) {
LAB_0047d105:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      piVar1 = (p->vMigRefs).pArray + uVar6;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Mpm_ObjRecycleCuts(p,pMVar8);
      }
    }
    uVar6 = (uint)pObj->pFans[3] >> 1;
    if ((int)uVar6 < (p->vMigRefs).nSize) {
      if ((p->vMigRefs).pArray[uVar6] == 0) {
        Mpm_ObjRecycleCuts(p,pObj);
      }
      return 1;
    }
  }
LAB_0047d0e6:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Mpm_ManDeriveCuts( Mpm_Man_t * p, Mig_Obj_t * pObj )
{
    Mpm_Cut_t * pCut0, * pCut1, * pCut2;
    int Required = Mpm_ObjRequired( p, pObj );
    int hCutBest = Mpm_ObjCutBest( p, pObj );
    int c0, c1, c2;
#ifdef MIG_RUNTIME
abctime clk;
#endif

    assert( Vec_PtrSize( &p->vFreeUnits ) == p->nNumCuts + 1 );
    assert( Mpm_ObjCutList(p, pObj) == 0 );
    p->nCutStore = 0;
    if ( hCutBest > 0 ) // cut list is assigned
    {
        Mpm_Cut_t * pCut = Mpm_ObjCutBestP( p, pObj ); 
        int Times = Mpm_CutGetArrTime( p, pCut );
        assert( pCut->hNext == 0 );
        if ( Times > Required )
            printf( "Arrival time (%d) exceeds required time (%d) at object %d.\n", Times, Required, Mig_ObjId(pObj) );
        if ( p->fMainRun )
            Mpm_ObjAddCutToStore( p, Mpm_ManMergeCuts(p, pCut, NULL, NULL), Times );
        else
            Mpm_ObjSetTime( p, pObj, Times );
    }
    // start storage with choice cuts
    if ( Mig_ManChoiceNum(p->pMig) && Mig_ObjSiblId(pObj) )
        Mpm_ObjAddChoiceCutsToStore( p, pObj, Mig_ObjSibl(pObj), Required );

#ifdef MIG_RUNTIME
clk = Abc_Clock();
#endif
    Mpm_ObjPrepareFanins( p, pObj );
    if ( Mig_ObjIsNode2(pObj) )
    {
        // go through cut pairs
        for ( c0 = 0; c0 < p->nCuts[0] && (pCut0 = p->pCuts[0][c0]); c0++ )
        for ( c1 = 0; c1 < p->nCuts[1] && (pCut1 = p->pCuts[1][c1]); c1++ )
            if ( Abc_TtCountOnes(p->pSigns[0][c0] | p->pSigns[1][c1]) <= p->nLutSize )
                if ( !Mpm_ManExploreNewCut( p, pObj, pCut0, pCut1, NULL, Required ) )
                    goto finish;
    }
    else if ( Mig_ObjIsNode3(pObj) )
    {
        // go through cut triples
        for ( c0 = 0; c0 < p->nCuts[0] && (pCut0 = p->pCuts[0][c0]); c0++ )
        for ( c1 = 0; c1 < p->nCuts[1] && (pCut1 = p->pCuts[1][c1]); c1++ )
        for ( c2 = 0; c2 < p->nCuts[2] && (pCut2 = p->pCuts[2][c2]); c2++ )
            if ( Abc_TtCountOnes(p->pSigns[0][c0] | p->pSigns[1][c1] | p->pSigns[2][c2]) <= p->nLutSize )
                if ( !Mpm_ManExploreNewCut( p, pObj, pCut0, pCut1, pCut2, Required ) )
                    goto finish;
    }
    else assert( 0 );
#ifdef MIG_RUNTIME
p->timeDerive += Abc_Clock() - clk;
#endif

finish:
    // save best cut
    assert( p->nCutStore > 0 );
    if ( p->pCutStore[0]->mTime <= Required )
    {
        Mpm_Cut_t * pCut;
        if ( hCutBest )
            Mmr_StepRecycle( p->pManCuts, hCutBest );
        hCutBest = Mpm_CutCreate( p, &p->pCutStore[0]->pCut, &pCut );
        Mpm_ObjSetCutBest( p, pObj, hCutBest );
        Mpm_ObjSetTime( p, pObj, p->pCutStore[0]->mTime );
        Mpm_ObjSetArea( p, pObj, p->pCutStore[0]->mArea );
        Mpm_ObjSetEdge( p, pObj, p->pCutStore[0]->mEdge );
    }
    else assert( !p->fMainRun );
    assert( hCutBest > 0 );
    // transform internal storage into regular cuts
    Mpm_ObjTranslateCutsFromStore( p, pObj );
    // dereference fanin cuts and reference node
    Mpm_ObjDerefFaninCuts( p, pObj );
    return 1;
}